

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void m68k_copy_line(TCGContext_conflict2 *tcg_ctx,TCGv_i32 dst,TCGv_i32 src,int index)

{
  TCGTemp *ts;
  TCGTemp *ts_00;
  TCGTemp *ts_01;
  ulong idx;
  TCGv_i32 ret;
  
  ts = tcg_temp_new_internal_m68k(tcg_ctx,TCG_TYPE_I32,false);
  ret = (TCGv_i32)((long)ts - (long)tcg_ctx);
  ts_00 = tcg_temp_new_internal_m68k(tcg_ctx,TCG_TYPE_I64,false);
  ts_01 = tcg_temp_new_internal_m68k(tcg_ctx,TCG_TYPE_I64,false);
  tcg_gen_andi_i32_m68k(tcg_ctx,ret,src,-0x10);
  idx = (ulong)(uint)index;
  tcg_gen_qemu_ld_i64_m68k(tcg_ctx,(TCGv_i64)((long)ts_00 - (long)tcg_ctx),ret,idx,MO_BEQ);
  tcg_gen_addi_i32_m68k(tcg_ctx,ret,ret,8);
  tcg_gen_qemu_ld_i64_m68k(tcg_ctx,(TCGv_i64)((long)ts_01 - (long)tcg_ctx),ret,idx,MO_BEQ);
  tcg_gen_andi_i32_m68k(tcg_ctx,ret,dst,-0x10);
  tcg_gen_qemu_st_i64_m68k(tcg_ctx,(TCGv_i64)((long)ts_00 - (long)tcg_ctx),ret,idx,MO_BEQ);
  tcg_gen_addi_i32_m68k(tcg_ctx,ret,ret,8);
  tcg_gen_qemu_st_i64_m68k(tcg_ctx,(TCGv_i64)((long)ts_01 - (long)tcg_ctx),ret,idx,MO_BEQ);
  tcg_temp_free_internal_m68k(tcg_ctx,ts_00);
  tcg_temp_free_internal_m68k(tcg_ctx,ts_01);
  tcg_temp_free_internal_m68k(tcg_ctx,ts);
  return;
}

Assistant:

static void m68k_copy_line(TCGContext *tcg_ctx, TCGv dst, TCGv src, int index)
{
    TCGv addr;
    TCGv_i64 t0, t1;

    addr = tcg_temp_new(tcg_ctx);

    t0 = tcg_temp_new_i64(tcg_ctx);
    t1 = tcg_temp_new_i64(tcg_ctx);

    tcg_gen_andi_i32(tcg_ctx, addr, src, ~15);
    tcg_gen_qemu_ld64(tcg_ctx, t0, addr, index);
    tcg_gen_addi_i32(tcg_ctx, addr, addr, 8);
    tcg_gen_qemu_ld64(tcg_ctx, t1, addr, index);

    tcg_gen_andi_i32(tcg_ctx, addr, dst, ~15);
    tcg_gen_qemu_st64(tcg_ctx, t0, addr, index);
    tcg_gen_addi_i32(tcg_ctx, addr, addr, 8);
    tcg_gen_qemu_st64(tcg_ctx, t1, addr, index);

    tcg_temp_free_i64(tcg_ctx, t0);
    tcg_temp_free_i64(tcg_ctx, t1);
    tcg_temp_free(tcg_ctx, addr);
}